

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *os,Printed *printed)

{
  ostream *poVar1;
  HeapType local_d8 [3];
  function<wasm::TypeNames_(wasm::HeapType)> local_c0;
  TypePrinter local_a0;
  Printed *local_18;
  Printed *printed_local;
  ostream *os_local;
  
  local_18 = printed;
  printed_local = (Printed *)os;
  std::function<wasm::TypeNames_(wasm::HeapType)>::function(&local_c0,&printed->generateName);
  anon_unknown_0::TypePrinter::TypePrinter(&local_a0,os,&local_c0);
  HeapType::HeapType(local_d8,printed->typeID);
  poVar1 = anon_unknown_0::TypePrinter::print(&local_a0,local_d8[0]);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_a0);
  std::function<wasm::TypeNames_(wasm::HeapType)>::~function(&local_c0);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HeapType::Printed printed) {
  return TypePrinter(os, printed.generateName).print(HeapType(printed.typeID));
}